

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O0

void microatf_context_validate_expect(microatf_context_t *context)

{
  microatf_context_t *context_local;
  
  if (context->expect == MICROATF_EXPECT_FAIL) {
    if (context->expect_fail_count == context->expect_previous_fail_count) {
      microatf_context_write_result
                (context,"failed",-1,"Test case was expecting a failure but none were raised");
      microatf_context_exit(context,1);
    }
  }
  else if (context->expect != MICROATF_EXPECT_PASS) {
    microatf_context_write_result(context,"failed",-1,"Test case continued");
    microatf_context_exit(context,1);
  }
  return;
}

Assistant:

static void
microatf_context_validate_expect(microatf_context_t *context)
{
	if (context->expect == MICROATF_EXPECT_FAIL) {
		if (context->expect_fail_count ==
		    context->expect_previous_fail_count) {
			microatf_context_write_result(context, "failed", -1,
			    "Test case was expecting a failure but none were "
			    "raised");
			microatf_context_exit(context, EXIT_FAILURE);
		}
	} else if (context->expect) {
		microatf_context_write_result(context, "failed", -1,
		    "Test case continued");
		microatf_context_exit(context, EXIT_FAILURE);
	}
}